

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *this;
  MapFieldBase *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other_00;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this = Reflection::MutableRaw<google::protobuf::internal::MapFieldBase>(r,lhs,field);
    other = Reflection::MutableRaw<google::protobuf::internal::MapFieldBase>(r,rhs,field);
    MapFieldBase::Swap(this,other);
    return;
  }
  this_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,lhs,field);
  other_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,rhs,field);
  RepeatedPtrFieldBase::
  Swap<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this_00,other_00);
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedMessageField(const Reflection* r,
                                               Message* lhs, Message* rhs,
                                               const FieldDescriptor* field) {
  if (IsMapFieldInApi(field)) {
    auto* lhs_map = r->MutableRaw<MapFieldBase>(lhs, field);
    auto* rhs_map = r->MutableRaw<MapFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_map->InternalSwap(rhs_map);
    } else {
      lhs_map->Swap(rhs_map);
    }
  } else {
    auto* lhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
    auto* rhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_rm->InternalSwap(rhs_rm);
    } else {
      lhs_rm->Swap<GenericTypeHandler<Message>>(rhs_rm);
    }
  }
}